

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_grp_start(MppSThdGrp grp)

{
  char *pcVar1;
  int local_20;
  RK_S32 i;
  MppSThdStatus status;
  MppSThdGrpImpl *impl;
  MppSThdGrp grp_local;
  
  if ((grp == (MppSThdGrp)0x0) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl",
                 "mpp_sthd_grp_start",0x242), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)grp + 0x18));
  if (*(MppSThdStatus *)((long)grp + 0x14) == MPP_STHD_READY) {
    for (local_20 = 0; local_20 < *(int *)((long)grp + 0x10); local_20 = local_20 + 1) {
      mpp_sthd_start((MppSThd)((long)grp + (long)local_20 * 0x88 + 0x40));
    }
    *(undefined4 *)((long)grp + 0x14) = 2;
  }
  else {
    pcVar1 = state2str(*(MppSThdStatus *)((long)grp + 0x14));
    _mpp_log_l(2,"mpp_thread","%s can NOT start on %s\n",(char *)0x0,grp,pcVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)grp + 0x18));
  return;
}

Assistant:

void mpp_sthd_grp_start(MppSThdGrp grp)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    MppSThdStatus status;

    mpp_assert(impl);

    /* we can only change callback function on uninit */
    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_READY : {
        RK_S32 i;

        for (i = 0; i < impl->count; i++)
            mpp_sthd_start(&impl->thds[i]);

        impl->status = MPP_STHD_RUNNING;
    } break;
    default : {
        mpp_err("%s can NOT start on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);
}